

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minisketch.cpp
# Opt level: O0

bool anon_unknown.dwarf_250a9ab::EnableClmul(void)

{
  int iVar1;
  long in_FS_OFFSET;
  uint *unaff_retaddr;
  uint *in_stack_00000008;
  uint32_t edx;
  uint32_t ecx;
  uint32_t ebx;
  uint32_t eax;
  bool local_19;
  uint local_14;
  uint *__edx;
  
  __edx = *(uint **)(in_FS_OFFSET + 0x28);
  iVar1 = __get_cpuid(ebx,_edx,in_stack_00000008,unaff_retaddr,__edx);
  local_19 = iVar1 != 0 && (local_14 & 2) != 0;
  if (*(uint **)(in_FS_OFFSET + 0x28) == __edx) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

static inline bool EnableClmul()
{
#ifdef _MSC_VER
    int regs[4];
    __cpuid(regs, 1);
    return (regs[2] & 0x2);
#else
    uint32_t eax, ebx, ecx, edx;
    return (__get_cpuid(1, &eax, &ebx, &ecx, &edx) && (ecx & 0x2));
#endif
}